

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

void __thiscall
capnp::InputStreamMessageReader::~InputStreamMessageReader(InputStreamMessageReader *this)

{
  word *pwVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  bool bVar5;
  Runnable local_20;
  InputStreamMessageReader *local_18;
  
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__InputStreamMessageReader_0027d190;
  if (this->readPos != (byte *)0x0) {
    bVar5 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar5) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_0027d278;
      local_18 = this;
      kj::UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
    }
    else {
      pAVar4 = (this->moreSegments).ptr;
      sVar2 = (this->moreSegments).size_;
      (*this->inputStream->_vptr_InputStream[3])
                (this->inputStream,
                 (long)pAVar4[sVar2 - 1].ptr + (pAVar4[sVar2 - 1].size_ * 8 - (long)this->readPos));
    }
  }
  pwVar1 = (this->ownedSpace).ptr;
  if (pwVar1 != (word *)0x0) {
    sVar2 = (this->ownedSpace).size_;
    (this->ownedSpace).ptr = (word *)0x0;
    (this->ownedSpace).size_ = 0;
    pAVar3 = (this->ownedSpace).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pwVar1,8,sVar2,sVar2,0);
  }
  pAVar4 = (this->moreSegments).ptr;
  if (pAVar4 != (ArrayPtr<const_capnp::word> *)0x0) {
    sVar2 = (this->moreSegments).size_;
    (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
    (this->moreSegments).size_ = 0;
    pAVar3 = (this->moreSegments).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pAVar4,0x10,sVar2,sVar2,0);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)this);
  return;
}

Assistant:

InputStreamMessageReader::~InputStreamMessageReader() noexcept(false) {
  if (readPos != nullptr) {
    unwindDetector.catchExceptionsIfUnwinding([&]() {
      // Note that lazy reads only happen when we have multiple segments, so moreSegments.back() is
      // valid.
      const byte* allEnd = reinterpret_cast<const byte*>(moreSegments.back().end());
      inputStream.skip(allEnd - readPos);
    });
  }
}